

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_param_test.cpp
# Opt level: O0

void __thiscall sign_verify_generic::test_method(sign_verify_generic *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uchar *puVar4;
  size_type sVar5;
  pointer pvVar6;
  array<unsigned_char,_32UL> *in_stack_00000610;
  size_t siglen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  picnic_publickey_t gen_public_key;
  picnic_privatekey_t gen_private_key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serialized_public_key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serialized_private_key;
  picnic_l1_ur_publickey_t public_key;
  picnic_l1_ur_privatekey_t private_key;
  array<unsigned_char,_32UL> m;
  size_t max_signature_size;
  undefined7 in_stack_fffffffffffff250;
  undefined1 in_stack_fffffffffffff257;
  lazy_ostream *in_stack_fffffffffffff258;
  array<unsigned_char,_32UL> *this_00;
  size_type in_stack_fffffffffffff268;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff270;
  undefined7 in_stack_fffffffffffff288;
  undefined1 in_stack_fffffffffffff28f;
  lazy_ostream *in_stack_fffffffffffff290;
  const_string *in_stack_fffffffffffff298;
  unit_test_log_t *in_stack_fffffffffffff2a0;
  undefined8 in_stack_fffffffffffff2d0;
  undefined8 uVar7;
  undefined7 in_stack_fffffffffffff2d8;
  undefined1 in_stack_fffffffffffff2df;
  undefined8 in_stack_fffffffffffff460;
  undefined8 uVar8;
  undefined7 in_stack_fffffffffffff468;
  undefined1 in_stack_fffffffffffff46f;
  basic_cstring<const_char> local_ab0;
  basic_cstring<const_char> local_aa0;
  lazy_ostream local_a90 [2];
  undefined1 local_a6b;
  assertion_result local_a68;
  basic_cstring<const_char> local_a40;
  basic_cstring<const_char> local_a30;
  basic_cstring<const_char> local_a20;
  lazy_ostream local_a10 [2];
  undefined1 local_9eb;
  assertion_result local_9e8;
  basic_cstring<const_char> local_9c0;
  basic_cstring<const_char> local_9b0;
  basic_cstring<const_char> local_9a0;
  lazy_ostream local_990 [4];
  assertion_result local_950;
  basic_cstring<const_char> local_928;
  basic_cstring<const_char> local_918;
  basic_cstring<const_char> local_908;
  lazy_ostream local_8f8 [2];
  undefined4 local_8d8;
  assertion_result local_8b8;
  basic_cstring<const_char> local_890;
  basic_cstring<const_char> local_880;
  basic_cstring<const_char> local_870;
  lazy_ostream local_860 [2];
  undefined1 local_83b;
  assertion_result local_838;
  basic_cstring<const_char> local_810;
  basic_cstring<const_char> local_800;
  basic_cstring<const_char> local_7f0;
  lazy_ostream local_7e0 [2];
  undefined1 local_7bb;
  assertion_result local_7b8;
  basic_cstring<const_char> local_790;
  basic_cstring<const_char> local_780;
  basic_cstring<const_char> local_770;
  lazy_ostream local_760 [2];
  undefined1 local_73b;
  assertion_result local_738;
  basic_cstring<const_char> local_710;
  basic_cstring<const_char> local_700;
  basic_cstring<const_char> local_6f0;
  lazy_ostream local_6e0 [4];
  assertion_result local_6a0;
  basic_cstring<const_char> local_678;
  basic_cstring<const_char> local_668;
  basic_cstring<const_char> local_658;
  lazy_ostream local_648 [2];
  undefined4 local_628;
  assertion_result local_608;
  basic_cstring<const_char> local_5e0;
  basic_cstring<const_char> local_5d0;
  basic_cstring<const_char> local_5c0;
  lazy_ostream local_5b0 [2];
  undefined1 local_58b;
  assertion_result local_588;
  basic_cstring<const_char> local_560;
  undefined8 local_550 [4];
  basic_cstring<const_char> local_530;
  basic_cstring<const_char> local_520;
  lazy_ostream local_510 [2];
  undefined1 local_4eb;
  assertion_result local_4e8;
  basic_cstring<const_char> local_4c0;
  basic_cstring<const_char> local_4b0;
  basic_cstring<const_char> local_4a0;
  lazy_ostream local_490 [2];
  undefined1 local_46b;
  assertion_result local_468;
  basic_cstring<const_char> local_440;
  undefined1 local_42a [65];
  undefined1 local_3e9 [97];
  basic_cstring<const_char> local_388;
  basic_cstring<const_char> local_378;
  lazy_ostream local_368 [2];
  size_type local_348;
  undefined4 local_33c;
  assertion_result local_320;
  basic_cstring<const_char> local_2f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2e8;
  basic_cstring<const_char> local_2d0;
  basic_cstring<const_char> local_2c0;
  lazy_ostream local_2b0 [2];
  size_type local_290;
  undefined4 local_284;
  assertion_result local_268;
  basic_cstring<const_char> local_240;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_230;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  lazy_ostream local_1f8 [2];
  undefined1 local_1d3;
  assertion_result local_1d0;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  lazy_ostream local_178 [2];
  undefined1 local_153;
  assertion_result local_150;
  basic_cstring<const_char> local_128;
  undefined1 local_118 [32];
  undefined1 local_f8 [48];
  array<unsigned_char,_32UL> local_c8;
  basic_cstring<const_char> local_a8;
  basic_cstring<const_char> local_98 [2];
  lazy_ostream local_78 [3];
  assertion_result local_48;
  basic_cstring<const_char> local_20;
  undefined8 local_10;
  
  local_10 = picnic_l1_ur_signature_size();
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
              ((value_expr<const_unsigned_long_&> *)
               CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8),
               SUB81((ulong)in_stack_fffffffffffff2d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_98,"max_signature_size",0x12);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_48,local_78,&local_a8,0x39,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13e7ec);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13e7f9);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  (anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>(in_stack_00000610);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    iVar3 = picnic_l1_ur_keygen(local_118,local_f8);
    local_153 = iVar3 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (bool *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8),
               SUB81((ulong)in_stack_fffffffffffff2d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,"!picnic_l1_ur_keygen(&public_key, &private_key)",0x2f);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_150,local_178,&local_198,0x41,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13e982);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13e98f);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    iVar3 = picnic_l1_ur_validate_keypair(local_f8,local_118);
    local_1d3 = iVar3 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (bool *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8),
               SUB81((ulong)in_stack_fffffffffffff2d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,"!picnic_l1_ur_validate_keypair(&private_key, &public_key)",0x39);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_1d0,local_1f8,&local_218,0x44,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13eb0d);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13eb1a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13eb34);
  picnic_l1_ur_get_private_key_size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13ebce);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_230);
    local_284 = picnic_l1_ur_write_private_key(local_f8,puVar4,sVar5);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (int *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    local_290 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_230);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_fffffffffffff258,
                 (unsigned_long *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468),
               SUB81((ulong)in_stack_fffffffffffff460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,
               "picnic_l1_ur_write_private_key(&private_key, serialized_private_key.data(), serialized_private_key.size()) == serialized_private_key.size()"
               ,0x8b);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_268,local_2b0,&local_2d0,0x4b,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13ed2b);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13ed38);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13ed64);
  picnic_l1_ur_get_public_key_size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13edfe);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_2e8);
    local_33c = picnic_l1_ur_write_public_key(local_118,puVar4,sVar5);
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (int *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    local_348 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_2e8);
    boost::test_tools::assertion::expression_base<boost::test_tools::assertion::value_expr<int>,int>
    ::operator==((expression_base<boost::test_tools::assertion::value_expr<int>,_int> *)
                 in_stack_fffffffffffff258,
                 (unsigned_long *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468),
               SUB81((ulong)in_stack_fffffffffffff460 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_378,
               "picnic_l1_ur_write_public_key(&public_key, serialized_public_key.data(), serialized_public_key.size()) == serialized_public_key.size()"
               ,0x86);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_320,local_368,&local_388,0x51,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13ef5b);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13ef68);
    in_stack_fffffffffffff46f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff46f);
  do {
    uVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13effb);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_230);
    iVar3 = picnic_read_private_key(local_3e9,puVar4,sVar5);
    local_46b = iVar3 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (bool *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8),
               SUB81((ulong)in_stack_fffffffffffff2d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a0,
               "!picnic_read_private_key(&gen_private_key, serialized_private_key.data(), serialized_private_key.size())"
               ,0x68);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_468,local_490,&local_4b0,0x57,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13f127);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13f134);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13f1c7);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_2e8);
    iVar3 = picnic_read_public_key(local_42a,puVar4,sVar5);
    local_4eb = iVar3 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (bool *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8),
               SUB81((ulong)in_stack_fffffffffffff2d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_520,
               "!picnic_read_public_key(&gen_public_key, serialized_public_key.data(), serialized_public_key.size())"
               ,100);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_530,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_4e8,local_510,&local_530,0x59,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13f2f3);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13f300);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13f334);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  local_550[0] = local_10;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_560,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    pvVar6 = std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x13f3cd);
    sVar5 = std::array<unsigned_char,_32UL>::size(&local_c8);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13f3f7);
    iVar3 = picnic_l1_ur_sign(local_f8,pvVar6,sVar5,puVar4,local_550);
    local_58b = iVar3 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (bool *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8),
               SUB81((ulong)in_stack_fffffffffffff2d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c0,
               "!picnic_l1_ur_sign(&private_key, m.data(), m.size(), sig.data(), &siglen)",0x49);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_588,local_5b0,&local_5d0,0x60,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13f51e);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13f52b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    local_628 = 0;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator>((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
               *)in_stack_fffffffffffff258,
              (int *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
                *)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468),
               SUB81((ulong)uVar8 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_658,"siglen > 0",10);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_668,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_608,local_648,&local_668,0x61,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13f6b8);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13f6c5);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_678,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator<=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_fffffffffffff258,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468),
               SUB81((ulong)uVar8 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f0,"siglen <= max_signature_size",0x1c);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_700,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_6a0,local_6e0,&local_700,0x62,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13f847);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13f854);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_710,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    pvVar6 = std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x13f8e7);
    sVar5 = std::array<unsigned_char,_32UL>::size(&local_c8);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13f911);
    iVar3 = picnic_l1_ur_verify(local_118,pvVar6,sVar5,puVar4,local_550[0]);
    local_73b = iVar3 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (bool *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8),
               SUB81((ulong)in_stack_fffffffffffff2d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_770,
               "!picnic_l1_ur_verify(&public_key, m.data(), m.size(), sig.data(), siglen)",0x49);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_780,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_738,local_760,&local_780,100,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13fa38);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13fa45);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_790,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    pvVar6 = std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x13fad8);
    sVar5 = std::array<unsigned_char,_32UL>::size(&local_c8);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13fb02);
    iVar3 = picnic_verify(local_42a,pvVar6,sVar5,puVar4,local_550[0]);
    local_7bb = iVar3 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (bool *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8),
               SUB81((ulong)in_stack_fffffffffffff2d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f0,"!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen)",
               0x47);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_800,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_7b8,local_7e0,&local_800,0x65,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13fc29);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13fc36);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_550[0] = local_10;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_810,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    pvVar6 = std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x13fcd7);
    sVar5 = std::array<unsigned_char,_32UL>::size(&local_c8);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13fd01);
    iVar3 = picnic_sign(local_3e9,pvVar6,sVar5,puVar4,local_550);
    local_83b = iVar3 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (bool *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)CONCAT17(in_stack_fffffffffffff2df,in_stack_fffffffffffff2d8),
               SUB81((ulong)in_stack_fffffffffffff2d0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_870,"!picnic_sign(&gen_private_key, m.data(), m.size(), sig.data(), &siglen)",
               0x47);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_880,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_838,local_860,&local_880,0x69,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13fe28);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13fe35);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_890,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    local_8d8 = 0;
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator>((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
               *)in_stack_fffffffffffff258,
              (int *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
                *)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468),
               SUB81((ulong)uVar8 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_908,"siglen > 0",10);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_918,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_8b8,local_8f8,&local_918,0x6a,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x13ffc2);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x13ffcf);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  do {
    uVar7 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_928,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::
    expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
    operator<=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                *)in_stack_fffffffffffff258,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
    ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
                *)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468),
               SUB81((ulong)uVar8 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9a0,"siglen <= max_signature_size",0x1c);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_950,local_990,&local_9b0,0x6b,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x140151);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x14015e);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    in_stack_fffffffffffff298 = (const_string *)&local_c8;
    in_stack_fffffffffffff2a0 =
         (unit_test_log_t *)
         std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x1401e2);
    sVar5 = std::array<unsigned_char,_32UL>::size
                      ((array<unsigned_char,_32UL> *)in_stack_fffffffffffff298);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x140203);
    iVar3 = picnic_l1_ur_verify(local_118,in_stack_fffffffffffff2a0,sVar5,puVar4,local_550[0]);
    local_9eb = iVar3 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (bool *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)CONCAT17(uVar2,in_stack_fffffffffffff2d8),
               SUB81((ulong)uVar7 >> 0x38,0));
    in_stack_fffffffffffff290 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a20,
               "!picnic_l1_ur_verify(&public_key, m.data(), m.size(), sig.data(), siglen)",0x49);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a30,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_9e8,local_a10,&local_a30,0x6d,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x140318);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x140325);
    in_stack_fffffffffffff28f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff28f);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a40,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,(size_t)in_stack_fffffffffffff290
               ,(const_string *)CONCAT17(in_stack_fffffffffffff28f,in_stack_fffffffffffff288));
    this_00 = &local_c8;
    pvVar6 = std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x1403a9);
    sVar5 = std::array<unsigned_char,_32UL>::size(this_00);
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1403ca);
    iVar3 = picnic_verify(local_42a,pvVar6,sVar5,puVar4,local_550[0]);
    local_a6b = iVar3 == 0;
    boost::test_tools::assertion::seed::operator->*
              ((seed *)in_stack_fffffffffffff258,
               (bool *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::test_tools::assertion::value_expr<bool>::evaluate
              ((value_expr<bool> *)CONCAT17(uVar2,in_stack_fffffffffffff2d8),
               SUB81((ulong)uVar7 >> 0x38,0));
    in_stack_fffffffffffff258 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_aa0,"!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen)",
               0x47);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff258,
               (basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ab0,
               "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion
              (&local_a68,local_a90,&local_ab0,0x6e,CHECK,CHECK_BUILT_ASSERTION,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x1404df);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1404ec);
    in_stack_fffffffffffff257 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff257);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_verify_generic) {
  const size_t max_signature_size = PICNIC_CONCAT(PARAM, signature_size)();
  BOOST_TEST(max_signature_size);

  std::array<uint8_t, 32> m;
  randomize_container(m);

  // Create a key pair
  PICNIC_CONCAT(PARAM, privatekey_t) private_key;
  PICNIC_CONCAT(PARAM, publickey_t) public_key;
  BOOST_TEST(!PICNIC_CONCAT(PARAM, keygen)(&public_key, &private_key));

  // Valid key pair
  BOOST_TEST(!PICNIC_CONCAT(PARAM, validate_keypair)(&private_key, &public_key));

  // Serialize key pair
  std::vector<uint8_t> serialized_private_key;
  serialized_private_key.resize(PICNIC_CONCAT(PARAM, get_private_key_size()));
  BOOST_TEST(PICNIC_CONCAT(PARAM, write_private_key)(&private_key, serialized_private_key.data(),
                                                     serialized_private_key.size()) ==
             serialized_private_key.size());

  std::vector<uint8_t> serialized_public_key;
  serialized_public_key.resize(PICNIC_CONCAT(PARAM, get_public_key_size()));
  BOOST_TEST(PICNIC_CONCAT(PARAM, write_public_key)(&public_key, serialized_public_key.data(),
                                                    serialized_public_key.size()) ==
             serialized_public_key.size());

  // Deserialize key pair
  picnic_privatekey_t gen_private_key;
  picnic_publickey_t gen_public_key;
  BOOST_TEST(!picnic_read_private_key(&gen_private_key, serialized_private_key.data(),
                                      serialized_private_key.size()));
  BOOST_TEST(!picnic_read_public_key(&gen_public_key, serialized_public_key.data(),
                                     serialized_public_key.size()));

  std::vector<uint8_t> sig;
  sig.resize(max_signature_size);
  size_t siglen = max_signature_size;

  // Sign a message
  BOOST_TEST(!PICNIC_CONCAT(PARAM, sign)(&private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
  BOOST_TEST(!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen));

  siglen = max_signature_size;
  // Sign another message
  BOOST_TEST(!picnic_sign(&gen_private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
  BOOST_TEST(!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen));
}